

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::buildStateTable(RBBITableBuilder *this)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint lastInputSymbol_00;
  RBBINode *pRVar4;
  UnicodeSet *pUVar5;
  char *pcVar6;
  int *piVar7;
  void *pvVar8;
  RBBIStateDescriptor *this_00;
  RBBINode *in_RSI;
  RBBIStateDescriptor *local_160;
  RBBINode *local_140;
  UnicodeSet *local_128;
  RBBINode *local_118;
  UnicodeSet *local_108;
  RBBINode *local_f8;
  RBBIStateDescriptor *newState;
  RBBIStateDescriptor *temp2;
  int ix;
  UBool UinDstates;
  int32_t ux;
  uint local_ac;
  int32_t px;
  RBBINode *p;
  UVector *U;
  int32_t a;
  RBBIStateDescriptor *temp;
  char *pcStack_80;
  int32_t tx;
  RBBIStateDescriptor *T;
  RBBINode *pRStack_20;
  int lastInputSymbol;
  RBBIStateDescriptor *initialState;
  RBBIStateDescriptor *failState;
  RBBITableBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*this->fStatus);
  if (UVar2 == '\0') {
    pRStack_20 = (RBBINode *)0x0;
    iVar3 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
    lastInputSymbol_00 = iVar3 - 1;
    pRVar4 = (RBBINode *)UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
    local_f8 = (RBBINode *)0x0;
    if (pRVar4 != (RBBINode *)0x0) {
      in_RSI = (RBBINode *)(ulong)lastInputSymbol_00;
      RBBIStateDescriptor::RBBIStateDescriptor
                ((RBBIStateDescriptor *)pRVar4,lastInputSymbol_00,this->fStatus);
      local_f8 = pRVar4;
    }
    if (local_f8 == (RBBINode *)0x0) {
      *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
      local_108 = (UnicodeSet *)0x0;
      if (pUVar5 != (UnicodeSet *)0x0) {
        in_RSI = (RBBINode *)this->fStatus;
        UVector::UVector((UVector *)pUVar5,(UErrorCode *)in_RSI);
        local_108 = pUVar5;
      }
      local_f8->fInputSet = local_108;
      if (local_f8->fInputSet == (UnicodeSet *)0x0) {
        *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
      }
      if ((local_f8->fInputSet != (UnicodeSet *)0x0) &&
         (UVar2 = ::U_FAILURE(*this->fStatus), UVar2 == '\0')) {
        in_RSI = local_f8;
        UVector::addElement(this->fDStates,local_f8,this->fStatus);
        UVar2 = ::U_FAILURE(*this->fStatus);
        if (UVar2 == '\0') {
          pRVar4 = (RBBINode *)UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
          local_118 = (RBBINode *)0x0;
          if (pRVar4 != (RBBINode *)0x0) {
            in_RSI = (RBBINode *)(ulong)lastInputSymbol_00;
            RBBIStateDescriptor::RBBIStateDescriptor
                      ((RBBIStateDescriptor *)pRVar4,lastInputSymbol_00,this->fStatus);
            local_118 = pRVar4;
          }
          pRStack_20 = local_118;
          if (local_118 == (RBBINode *)0x0) {
            *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
          }
          UVar2 = ::U_FAILURE(*this->fStatus);
          if (UVar2 == '\0') {
            pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
            local_128 = (UnicodeSet *)0x0;
            if (pUVar5 != (UnicodeSet *)0x0) {
              in_RSI = (RBBINode *)this->fStatus;
              UVector::UVector((UVector *)pUVar5,(UErrorCode *)in_RSI);
              local_128 = pUVar5;
            }
            local_118->fInputSet = local_128;
            if (local_118->fInputSet == (UnicodeSet *)0x0) {
              *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
            }
            UVar2 = ::U_FAILURE(*this->fStatus);
            if (UVar2 == '\0') {
              setAdd(this,(UVector *)local_118->fInputSet,(*this->fTree)->fFirstPosSet);
              UVector::addElement(this->fDStates,local_118,this->fStatus);
              UVar2 = ::U_FAILURE(*this->fStatus);
              in_RSI = local_118;
              if (UVar2 == '\0') {
                do {
                  pcStack_80 = (char *)0x0;
                  for (temp._4_4_ = 1; iVar3 = UVector::size(this->fDStates), pcVar6 = pcStack_80,
                      (int)temp._4_4_ < iVar3; temp._4_4_ = temp._4_4_ + 1) {
                    local_118 = (RBBINode *)(ulong)temp._4_4_;
                    pcVar6 = (char *)UVector::elementAt(this->fDStates,temp._4_4_);
                    if (*pcVar6 == '\0') break;
                  }
                  pcStack_80 = pcVar6;
                  if (pcStack_80 == (char *)0x0) {
                    return;
                  }
                  *pcStack_80 = '\x01';
                  for (U._4_4_ = 1; U._4_4_ <= (int)lastInputSymbol_00; U._4_4_ = U._4_4_ + 1) {
                    p = (RBBINode *)0x0;
                    for (local_ac = 0; iVar3 = UVector::size(*(UVector **)(pcStack_80 + 0x20)),
                        (int)local_ac < iVar3; local_ac = local_ac + 1) {
                      local_118 = (RBBINode *)(ulong)local_ac;
                      piVar7 = (int *)UVector::elementAt(*(UVector **)(pcStack_80 + 0x20),local_ac);
                      if ((*piVar7 == 3) && (piVar7[0x1f] == U._4_4_)) {
                        if (p == (RBBINode *)0x0) {
                          pRVar4 = (RBBINode *)
                                   UMemory::operator_new((UMemory *)0x28,(size_t)local_118);
                          local_140 = (RBBINode *)0x0;
                          if (pRVar4 != (RBBINode *)0x0) {
                            local_118 = (RBBINode *)this->fStatus;
                            UVector::UVector((UVector *)pRVar4,(UErrorCode *)local_118);
                            local_140 = pRVar4;
                          }
                          p = local_140;
                          if (local_140 == (RBBINode *)0x0) {
                            *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
                            in_RSI = local_118;
                            goto LAB_0035e684;
                          }
                        }
                        local_118 = p;
                        setAdd(this,(UVector *)p,*(UVector **)(piVar7 + 0x26));
                      }
                    }
                    ix = 0;
                    bVar1 = false;
                    if (p != (RBBINode *)0x0) {
                      for (temp2._0_4_ = 0; iVar3 = UVector::size(this->fDStates),
                          (int)temp2 < iVar3; temp2._0_4_ = (int)temp2 + 1) {
                        pvVar8 = UVector::elementAt(this->fDStates,(int)temp2);
                        local_118 = p;
                        UVar2 = setEquals(this,(UVector *)p,*(UVector **)((long)pvVar8 + 0x20));
                        if (UVar2 != '\0') {
                          if (p != (RBBINode *)0x0) {
                            (**(code **)(*(long *)p + 8))();
                          }
                          p = *(RBBINode **)((long)pvVar8 + 0x20);
                          ix = (int)temp2;
                          bVar1 = true;
                          break;
                        }
                      }
                      if (!bVar1) {
                        this_00 = (RBBIStateDescriptor *)
                                  UMemory::operator_new((UMemory *)0x30,(size_t)local_118);
                        local_160 = (RBBIStateDescriptor *)0x0;
                        if (this_00 != (RBBIStateDescriptor *)0x0) {
                          local_118 = (RBBINode *)(ulong)lastInputSymbol_00;
                          RBBIStateDescriptor::RBBIStateDescriptor
                                    (this_00,lastInputSymbol_00,this->fStatus);
                          local_160 = this_00;
                        }
                        if (local_160 == (RBBIStateDescriptor *)0x0) {
                          *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
                        }
                        UVar2 = ::U_FAILURE(*this->fStatus);
                        in_RSI = local_118;
                        if (UVar2 != '\0') goto LAB_0035e684;
                        local_160->fPositions = (UVector *)p;
                        UVector::addElement(this->fDStates,local_160,this->fStatus);
                        UVar2 = ::U_FAILURE(*this->fStatus);
                        if (UVar2 != '\0') {
                          return;
                        }
                        iVar3 = UVector::size(this->fDStates);
                        ix = iVar3 + -1;
                      }
                      local_118 = (RBBINode *)(ulong)(uint)ix;
                      UVector32::setElementAt(*(UVector32 **)(pcStack_80 + 0x28),ix,U._4_4_);
                    }
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
LAB_0035e684:
    if (pRStack_20 != (RBBINode *)0x0) {
      RBBIStateDescriptor::~RBBIStateDescriptor((RBBIStateDescriptor *)pRStack_20);
      UMemory::operator_delete((UMemory *)pRStack_20,in_RSI);
    }
    if (local_f8 != (RBBINode *)0x0) {
      RBBIStateDescriptor::~RBBIStateDescriptor((RBBIStateDescriptor *)local_f8);
      UMemory::operator_delete((UMemory *)local_f8,in_RSI);
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::buildStateTable() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    RBBIStateDescriptor *failState;
    // Set it to NULL to avoid uninitialized warning
    RBBIStateDescriptor *initialState = NULL; 
    //
    // Add a dummy state 0 - the stop state.  Not from Aho.
    int      lastInputSymbol = fRB->fSetBuilder->getNumCharCategories() - 1;
    failState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
    if (failState == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        goto ExitBuildSTdeleteall;
    }
    failState->fPositions = new UVector(*fStatus);
    if (failState->fPositions == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (failState->fPositions == NULL || U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    fDStates->addElement(failState, *fStatus);
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }

    // initially, the only unmarked state in Dstates is firstpos(root),
    //       where toot is the root of the syntax tree for (r)#;
    initialState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
    if (initialState == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    initialState->fPositions = new UVector(*fStatus);
    if (initialState->fPositions == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    setAdd(initialState->fPositions, fTree->fFirstPosSet);
    fDStates->addElement(initialState, *fStatus);
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }

    // while there is an unmarked state T in Dstates do begin
    for (;;) {
        RBBIStateDescriptor *T = NULL;
        int32_t              tx;
        for (tx=1; tx<fDStates->size(); tx++) {
            RBBIStateDescriptor *temp;
            temp = (RBBIStateDescriptor *)fDStates->elementAt(tx);
            if (temp->fMarked == FALSE) {
                T = temp;
                break;
            }
        }
        if (T == NULL) {
            break;
        }

        // mark T;
        T->fMarked = TRUE;

        // for each input symbol a do begin
        int32_t  a;
        for (a = 1; a<=lastInputSymbol; a++) {
            // let U be the set of positions that are in followpos(p)
            //    for some position p in T
            //    such that the symbol at position p is a;
            UVector    *U = NULL;
            RBBINode   *p;
            int32_t     px;
            for (px=0; px<T->fPositions->size(); px++) {
                p = (RBBINode *)T->fPositions->elementAt(px);
                if ((p->fType == RBBINode::leafChar) &&  (p->fVal == a)) {
                    if (U == NULL) {
                        U = new UVector(*fStatus);
                        if (U == NULL) {
                        	*fStatus = U_MEMORY_ALLOCATION_ERROR;
                        	goto ExitBuildSTdeleteall;
                        }
                    }
                    setAdd(U, p->fFollowPos);
                }
            }

            // if U is not empty and not in DStates then
            int32_t  ux = 0;
            UBool    UinDstates = FALSE;
            if (U != NULL) {
                U_ASSERT(U->size() > 0);
                int  ix;
                for (ix=0; ix<fDStates->size(); ix++) {
                    RBBIStateDescriptor *temp2;
                    temp2 = (RBBIStateDescriptor *)fDStates->elementAt(ix);
                    if (setEquals(U, temp2->fPositions)) {
                        delete U;
                        U  = temp2->fPositions;
                        ux = ix;
                        UinDstates = TRUE;
                        break;
                    }
                }

                // Add U as an unmarked state to Dstates
                if (!UinDstates)
                {
                    RBBIStateDescriptor *newState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
                    if (newState == NULL) {
                    	*fStatus = U_MEMORY_ALLOCATION_ERROR;
                    }
                    if (U_FAILURE(*fStatus)) {
                        goto ExitBuildSTdeleteall;
                    }
                    newState->fPositions = U;
                    fDStates->addElement(newState, *fStatus);
                    if (U_FAILURE(*fStatus)) {
                        return;
                    }
                    ux = fDStates->size()-1;
                }

                // Dtran[T, a] := U;
                T->fDtran->setElementAt(ux, a);
            }
        }
    }
    return;
    // delete local pointers only if error occured.
ExitBuildSTdeleteall:
    delete initialState;
    delete failState;
}